

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O2

void __thiscall TxIn_EstimateTxInVsize_Test::TestBody(TxIn_EstimateTxInVsize_Test *this)

{
  AssertHelper *this_00;
  AddressType AVar1;
  Script SVar2;
  bool bVar3;
  int iVar4;
  pointer pTVar5;
  long lVar6;
  char *message;
  initializer_list<TestEstimateTxInSizeVector> __l;
  undefined4 uStack_258;
  uint32_t vsize;
  undefined1 auStack_250 [16];
  pointer local_240;
  _Vector_impl_data local_238;
  AssertionResult gtest_ar;
  Script local_208;
  undefined8 local_1d0;
  undefined4 local_1c8;
  Script local_1c0;
  undefined8 local_188;
  undefined4 local_180;
  Script local_178;
  undefined8 local_140;
  undefined4 local_138;
  Script local_130;
  undefined8 local_f8;
  undefined4 local_f0;
  Script local_e8;
  undefined8 local_b0;
  undefined4 local_a8;
  Script local_a0;
  Script local_68;
  
  if (TestBody()::test_vector == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::test_vector);
    if (iVar4 != 0) {
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x96000000;
      gtest_ar.message_.ptr_._0_4_ = 0;
      cfd::core::Script::Script(&local_208);
      local_1d0 = 0xd000000001;
      local_1c8 = 0;
      cfd::core::Script::Script(&local_1c0,&exp_script);
      local_188 = 0x5c00000006;
      local_180 = 0;
      cfd::core::Script::Script(&local_178);
      local_140 = 0x7000000005;
      local_138 = 0;
      std::__cxx11::string::string((string *)&local_238,"51",(allocator *)(auStack_250 + 8));
      cfd::core::Script::Script(&local_130,(string *)&local_238);
      local_f8 = 0x4500000004;
      local_f0 = 0;
      cfd::core::Script::Script(&local_e8);
      local_b0 = 0x5300000003;
      local_a8 = 0;
      cfd::core::Script::Script(&local_a0,&exp_script);
      __l._M_len = 6;
      __l._M_array = (iterator)&gtest_ar;
      std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::vector
                (&TestBody::test_vector,__l,(allocator_type *)&vsize);
      lVar6 = 0x178;
      do {
        cfd::core::Script::~Script((Script *)(&gtest_ar.success_ + lVar6));
        lVar6 = lVar6 + -0x48;
      } while (lVar6 != -0x38);
      std::__cxx11::string::~string((string *)&local_238);
      __cxa_atexit(std::
                   vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::
                   ~vector,&TestBody::test_vector,&__dso_handle);
      __cxa_guard_release(&TestBody()::test_vector);
    }
  }
  local_240 = TestBody::test_vector.
              super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (AssertHelper *)(auStack_250 + 8);
  for (pTVar5 = TestBody::test_vector.
                super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>
                ._M_impl.super__Vector_impl_data._M_start; pTVar5 != local_240; pTVar5 = pTVar5 + 1)
  {
    vsize = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        AVar1 = pTVar5->addr_type;
        cfd::core::Script::Script(&local_68,&pTVar5->redeem_script);
        SVar2._vptr_Script._4_4_ = vsize;
        SVar2._vptr_Script._0_4_ = uStack_258;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_250._0_8_;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_250._8_8_;
        SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_240;
        SVar2.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data =
             (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
             (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
             local_238;
        vsize = cfd::core::TxIn::EstimateTxInVsize(AVar1,SVar2,&local_68);
        cfd::core::Script::~Script(&local_68);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                 ,0x52,
                 "Expected: (vsize = TxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"vsize","test_data.size",&vsize,&pTVar5->size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_238);
      message = "";
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) !=
          (undefined8 *)0x0) {
        message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                (this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                 ,0x53,message);
      testing::internal::AssertHelper::operator=(this_00,(Message *)&local_238);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_238);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(TxIn, EstimateTxInVsize) {
  static const std::vector<TestEstimateTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script()},
    {AddressType::kP2shAddress, 208, 0, exp_script},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script()},
    {AddressType::kP2shP2wshAddress, 112, 0, Script("51")},
    {AddressType::kP2wpkhAddress, 69, 0, Script()},
    {AddressType::kP2wshAddress, 83, 0, exp_script},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    EXPECT_NO_THROW((vsize = TxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script)));
    EXPECT_EQ(vsize, test_data.size);
  }
}